

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O2

int vorbis_staticbook_pack(static_codebook *c,oggpack_buffer *opb)

{
  char cVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  unsigned_long uVar6;
  unsigned_long value;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  oggpack_write(opb,0x564342,0x18);
  oggpack_write(opb,c->dim,0x10);
  oggpack_write(opb,c->entries,0x18);
  lVar8 = c->entries;
  lVar5 = 1;
  lVar7 = lVar5;
  if (1 < lVar8) {
    lVar7 = lVar8;
  }
  for (; lVar4 = lVar7, lVar5 < lVar8; lVar5 = lVar5 + 1) {
    cVar1 = c->lengthlist[lVar5 + -1];
    lVar4 = lVar5;
    if ((cVar1 == '\0') || (c->lengthlist[lVar5] < cVar1)) break;
  }
  if (lVar4 == lVar8) {
    oggpack_write(opb,1,1);
    oggpack_write(opb,(long)*c->lengthlist - 1,5);
    lVar5 = 0;
    for (lVar8 = 1; lVar8 < c->entries; lVar8 = lVar8 + 1) {
      cVar1 = c->lengthlist[lVar8];
      cVar2 = c->lengthlist[lVar8 + -1];
      if (cVar2 < cVar1) {
        lVar7 = (long)cVar1 - (long)cVar2;
        while (bVar9 = lVar7 != 0, lVar7 = lVar7 + -1, bVar9) {
          iVar3 = ov_ilog((int)c->entries - (int)lVar5);
          oggpack_write(opb,lVar8 - lVar5,iVar3);
          lVar5 = lVar8;
        }
      }
    }
    iVar3 = ov_ilog((int)c->entries - (int)lVar5);
    oggpack_write(opb,lVar8 - lVar5,iVar3);
  }
  else {
    lVar7 = 0;
    oggpack_write(opb,0,1);
    lVar8 = c->entries;
    lVar5 = 0;
    if (0 < lVar8) {
      lVar5 = lVar8;
    }
    for (; (lVar4 = lVar5, lVar5 != lVar7 && (lVar4 = lVar7, c->lengthlist[lVar7] != '\0'));
        lVar7 = lVar7 + 1) {
    }
    if (lVar4 == lVar8) {
      oggpack_write(opb,0,1);
      for (lVar8 = 0; lVar8 < c->entries; lVar8 = lVar8 + 1) {
        oggpack_write(opb,(long)c->lengthlist[lVar8] - 1,5);
      }
    }
    else {
      oggpack_write(opb,1,1);
      for (lVar8 = 0; lVar8 < c->entries; lVar8 = lVar8 + 1) {
        if (c->lengthlist[lVar8] == '\0') {
          uVar6 = 0;
          iVar3 = 1;
        }
        else {
          oggpack_write(opb,1,1);
          uVar6 = (long)c->lengthlist[lVar8] - 1;
          iVar3 = 5;
        }
        oggpack_write(opb,uVar6,iVar3);
      }
    }
  }
  oggpack_write(opb,(long)c->maptype,4);
  if (c->maptype - 1U < 2) {
    if (c->quantlist == (long *)0x0) {
      return -1;
    }
    oggpack_write(opb,c->q_min,0x20);
    oggpack_write(opb,c->q_delta,0x20);
    oggpack_write(opb,(long)c->q_quant - 1,4);
    oggpack_write(opb,(long)c->q_sequencep,1);
    if (c->maptype == 2) {
      iVar3 = (int)c->dim * (int)c->entries;
    }
    else if (c->maptype == 1) {
      lVar8 = _book_maptype1_quantvals(c);
      iVar3 = (int)lVar8;
    }
    else {
      iVar3 = -1;
    }
    lVar5 = 0;
    lVar8 = (long)iVar3;
    if ((long)iVar3 < 1) {
      lVar8 = lVar5;
    }
    for (; lVar8 != lVar5; lVar5 = lVar5 + 1) {
      uVar6 = c->quantlist[lVar5];
      value = -uVar6;
      if (0 < (long)uVar6) {
        value = uVar6;
      }
      oggpack_write(opb,value,c->q_quant);
    }
  }
  else if (c->maptype != 0) {
    return -1;
  }
  return 0;
}

Assistant:

int vorbis_staticbook_pack(const static_codebook *c,oggpack_buffer *opb){
  long i,j;
  int ordered=0;

  /* first the basic parameters */
  oggpack_write(opb,0x564342,24);
  oggpack_write(opb,c->dim,16);
  oggpack_write(opb,c->entries,24);

  /* pack the codewords.  There are two packings; length ordered and
     length random.  Decide between the two now. */

  for(i=1;i<c->entries;i++)
    if(c->lengthlist[i-1]==0 || c->lengthlist[i]<c->lengthlist[i-1])break;
  if(i==c->entries)ordered=1;

  if(ordered){
    /* length ordered.  We only need to say how many codewords of
       each length.  The actual codewords are generated
       deterministically */

    long count=0;
    oggpack_write(opb,1,1);  /* ordered */
    oggpack_write(opb,c->lengthlist[0]-1,5); /* 1 to 32 */

    for(i=1;i<c->entries;i++){
      char this=c->lengthlist[i];
      char last=c->lengthlist[i-1];
      if(this>last){
        for(j=last;j<this;j++){
          oggpack_write(opb,i-count,ov_ilog(c->entries-count));
          count=i;
        }
      }
    }
    oggpack_write(opb,i-count,ov_ilog(c->entries-count));

  }else{
    /* length random.  Again, we don't code the codeword itself, just
       the length.  This time, though, we have to encode each length */
    oggpack_write(opb,0,1);   /* unordered */

    /* algortihmic mapping has use for 'unused entries', which we tag
       here.  The algorithmic mapping happens as usual, but the unused
       entry has no codeword. */
    for(i=0;i<c->entries;i++)
      if(c->lengthlist[i]==0)break;

    if(i==c->entries){
      oggpack_write(opb,0,1); /* no unused entries */
      for(i=0;i<c->entries;i++)
        oggpack_write(opb,c->lengthlist[i]-1,5);
    }else{
      oggpack_write(opb,1,1); /* we have unused entries; thus we tag */
      for(i=0;i<c->entries;i++){
        if(c->lengthlist[i]==0){
          oggpack_write(opb,0,1);
        }else{
          oggpack_write(opb,1,1);
          oggpack_write(opb,c->lengthlist[i]-1,5);
        }
      }
    }
  }

  /* is the entry number the desired return value, or do we have a
     mapping? If we have a mapping, what type? */
  oggpack_write(opb,c->maptype,4);
  switch(c->maptype){
  case 0:
    /* no mapping */
    break;
  case 1:case 2:
    /* implicitly populated value mapping */
    /* explicitly populated value mapping */

    if(!c->quantlist){
      /* no quantlist?  error */
      return(-1);
    }

    /* values that define the dequantization */
    oggpack_write(opb,c->q_min,32);
    oggpack_write(opb,c->q_delta,32);
    oggpack_write(opb,c->q_quant-1,4);
    oggpack_write(opb,c->q_sequencep,1);

    {
      int quantvals;
      switch(c->maptype){
      case 1:
        /* a single column of (c->entries/c->dim) quantized values for
           building a full value list algorithmically (square lattice) */
        quantvals=_book_maptype1_quantvals(c);
        break;
      case 2:
        /* every value (c->entries*c->dim total) specified explicitly */
        quantvals=c->entries*c->dim;
        break;
      default: /* NOT_REACHABLE */
        quantvals=-1;
      }

      /* quantized values */
      for(i=0;i<quantvals;i++)
        oggpack_write(opb,labs(c->quantlist[i]),c->q_quant);

    }
    break;
  default:
    /* error case; we don't have any other map types now */
    return(-1);
  }

  return(0);
}